

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendDecimalValueInternal<duckdb::uhugeint_t,short>
          (BaseAppender *this,Vector *col,uhugeint_t input)

{
  byte bVar1;
  uint8_t width;
  InternalException *this_00;
  uhugeint_t input_00;
  uint8_t in_stack_ffffffffffffff98;
  allocator local_61;
  CastParameters parameters;
  
  if (this->appender_type == PHYSICAL) {
    AppendValueInternal<duckdb::uhugeint_t,short>(this,col,input);
    return;
  }
  if (this->appender_type == LOGICAL) {
    bVar1 = DecimalType::GetWidth(&col->type);
    width = DecimalType::GetScale(&col->type);
    parameters.cast_data.ptr = (BoundCastData *)0x0;
    parameters.strict = false;
    parameters.error_message = (string *)0x0;
    parameters.local_state.ptr = (FunctionLocalState *)0x0;
    parameters.query_location.index = 0xffffffffffffffff;
    parameters.nullify_parent = false;
    input_00.upper = col->data + (this->chunk).count * 2;
    input_00.lower = input.upper;
    TryCastToDecimal::Operation<duckdb::uhugeint_t,short>
              ((TryCastToDecimal *)input.lower,input_00,(int16_t *)&parameters,
               (CastParameters *)(ulong)bVar1,width,in_stack_ffffffffffffff98);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&parameters,"Type not implemented for AppenderType",&local_61);
  InternalException::InternalException(this_00,(string *)&parameters);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendDecimalValueInternal(Vector &col, SRC input) {
	switch (appender_type) {
	case AppenderType::LOGICAL: {
		auto &type = col.GetType();
		D_ASSERT(type.id() == LogicalTypeId::DECIMAL);
		auto width = DecimalType::GetWidth(type);
		auto scale = DecimalType::GetScale(type);
		CastParameters parameters;
		auto &result = FlatVector::GetData<DST>(col)[chunk.size()];
		TryCastToDecimal::Operation<SRC, DST>(input, result, parameters, width, scale);
		return;
	}
	case AppenderType::PHYSICAL: {
		AppendValueInternal<SRC, DST>(col, input);
		return;
	}
	default:
		throw InternalException("Type not implemented for AppenderType");
	}
}